

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc1::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc1 *this,EvalContext *ctx,Interval *iarg0)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  Interval local_d0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  Interval *local_90;
  ScopedRoundingMode point_ctx_;
  double local_80;
  double dStack_78;
  Interval local_70;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  dVar1 = iarg0->m_lo;
  if (dVar1 < iarg0->m_hi || dVar1 == iarg0->m_hi) {
    local_b8 = dVar1;
    point_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(local_b8,&local_d0,this,ctx);
    bVar2 = local_d0.m_hasNaN;
    local_a8 = local_d0.m_lo;
    dStack_a0 = local_d0.m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(local_b8,&local_d0,this,ctx);
    bVar3 = local_d0.m_hasNaN;
    local_48 = local_d0.m_lo;
    dStack_40 = local_d0.m_hi;
    tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
    local_b8 = iarg0->m_hi;
    point_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    local_90 = __return_storage_ptr__;
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(local_b8,&local_d0,this,ctx);
    uVar4 = local_d0._0_4_;
    local_58 = local_d0.m_lo;
    dStack_50 = local_d0.m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(local_b8,&local_d0,this,ctx);
    local_b8 = (double)(~-(ulong)(local_a8 <= local_48) & (ulong)local_48 |
                       (ulong)local_a8 & -(ulong)(local_a8 <= local_48));
    dStack_b0 = (double)(~-(ulong)(dStack_40 <= dStack_a0) & (ulong)dStack_40 |
                        (ulong)dStack_a0 & -(ulong)(dStack_40 <= dStack_a0));
    local_70.m_hasNaN = (bool)1;
    if ((uVar4 & 1) == 0) {
      local_70.m_hasNaN = local_d0.m_hasNaN;
    }
    if (((bVar2 | bVar3) & 1U) != 0) {
      local_70.m_hasNaN = (bool)1;
    }
    local_a8 = (double)(~-(ulong)(local_58 <= local_d0.m_lo) & (ulong)local_d0.m_lo |
                       (ulong)local_58 & -(ulong)(local_58 <= local_d0.m_lo));
    dStack_a0 = (double)(~-(ulong)(local_d0.m_hi <= dStack_50) & (ulong)local_d0.m_hi |
                        (ulong)dStack_50 & -(ulong)(local_d0.m_hi <= dStack_50));
    tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
    local_70.m_lo =
         (double)(~-(ulong)(local_b8 <= local_a8) & (ulong)local_a8 |
                 (ulong)local_b8 & -(ulong)(local_b8 <= local_a8));
    local_70.m_hi =
         (double)(~-(ulong)(dStack_a0 <= dStack_b0) & (ulong)dStack_a0 |
                 (ulong)dStack_b0 & -(ulong)(dStack_a0 <= dStack_b0));
    __return_storage_ptr__ = local_90;
  }
  else {
    local_70.m_lo = INFINITY;
    local_70.m_hi = -INFINITY;
    local_70.m_hasNaN = false;
  }
  if (iarg0->m_hasNaN == true) {
    local_d0.m_hasNaN = true;
    local_d0.m_lo = INFINITY;
    local_d0.m_hi = -INFINITY;
    tcu::Interval::operator|=(&local_70,&local_d0);
  }
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xb])(&local_d0,this,ctx,iarg0);
  tcu::Interval::operator|=(&local_70,&local_d0);
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xe])(&point_ctx_,this);
  local_d0.m_hasNaN = true;
  local_d0.m_lo =
       (double)(~-(ulong)(local_80 <= INFINITY) & 0x7ff0000000000000 |
               (ulong)local_80 & -(ulong)(local_80 <= INFINITY));
  local_d0.m_hi =
       (double)(~-(ulong)(-INFINITY <= dStack_78) & 0xfff0000000000000 |
               (ulong)dStack_78 & -(ulong)(-INFINITY <= dStack_78));
  tcu::Interval::operator&=(&local_70,&local_d0);
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_70);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext& ctx, const Interval& iarg0) const
	{
		Interval ret;

		TCU_INTERVAL_APPLY_MONOTONE1(ret, arg0, iarg0, val,
									 TCU_SET_INTERVAL(val, point,
													  point = this->applyPoint(ctx, arg0)));

		ret |= innerExtrema(ctx, iarg0);
		ret &= (this->getCodomain() | TCU_NAN);

		return ctx.format.convert(ret);
	}